

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O1

int dic_add(dictionary *dic,void *key,int keyn)

{
  keynode **ppkVar1;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  keynode *pkVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  
  while( true ) {
    uVar7 = 0x811c9dc5;
    puVar4 = (uint *)key;
    uVar8 = keyn;
    uVar9 = keyn;
    if (7 < keyn) {
      do {
        uVar7 = (uVar7 ^ puVar4[1] ^ (*puVar4 << 5 | *puVar4 >> 0x1b)) * 0xad3e7;
        uVar8 = uVar9 - 8;
        puVar4 = puVar4 + 2;
        bVar2 = 0xf < (int)uVar9;
        uVar9 = uVar8;
      } while (bVar2);
    }
    if ((uVar8 & 4) != 0) {
      uVar7 = ((uint)*(ushort *)((long)puVar4 + 2) ^ (uVar7 ^ (ushort)*puVar4) * 0xad3e7) * 0xad3e7;
      puVar4 = puVar4 + 1;
    }
    if ((uVar8 & 2) != 0) {
      uVar7 = (uVar7 ^ (ushort)*puVar4) * 0xad3e7;
      puVar4 = (uint *)((long)puVar4 + 2);
    }
    if ((uVar8 & 1) != 0) {
      uVar7 = (uVar7 ^ (int)(char)*puVar4) * 0xad3e7;
    }
    uVar8 = (uVar7 >> 0x10 ^ uVar7) % (uint)dic->length;
    ppkVar1 = dic->table;
    pkVar5 = ppkVar1[(int)uVar8];
    if (pkVar5 != (keynode *)0x0) break;
    iVar3 = dic->count;
    dVar10 = (double)dic->length;
    dVar11 = (double)iVar3 / dVar10;
    if (dVar11 < dic->growth_treshold || dVar11 == dic->growth_treshold) {
      pkVar5 = (keynode *)malloc(0x18);
      pkVar5->len = (uint8_t)keyn;
      pcVar6 = (char *)malloc((long)keyn);
      pkVar5->key = pcVar6;
      memcpy(pcVar6,key,(long)keyn);
      pkVar5->next = (keynode *)0x0;
      pkVar5->value = -1;
      ppkVar1[(int)uVar8] = pkVar5;
      dic->value = &dic->table[(int)uVar8]->value;
      dic->count = iVar3 + 1;
      return 0;
    }
    dic_resize(dic,(int)(dVar10 * dic->growth_factor));
  }
  while (((uint)pkVar5->len != keyn || (iVar3 = bcmp(pkVar5->key,key,(ulong)(uint)keyn), iVar3 != 0)
         )) {
    pkVar5 = pkVar5->next;
    if (pkVar5 == (keynode *)0x0) {
      dic->count = dic->count + 1;
      pkVar5 = (keynode *)malloc(0x18);
      pkVar5->len = (uint8_t)keyn;
      pcVar6 = (char *)malloc((long)keyn);
      pkVar5->key = pcVar6;
      memcpy(pcVar6,key,(long)keyn);
      pkVar5->next = (keynode *)0x0;
      pkVar5->value = -1;
      pkVar5->next = ppkVar1[(int)uVar8];
      ppkVar1[(int)uVar8] = pkVar5;
      dic->value = &pkVar5->value;
      return 0;
    }
  }
  dic->value = &pkVar5->value;
  return 1;
}

Assistant:

int dic_add(struct dictionary* dic, void *key, int keyn) {
	int n = hash_func((const char*)key, keyn) % dic->length;
	if (dic->table[n] == 0) {
		double f = (double)dic->count / (double)dic->length;
		if (f > dic->growth_treshold) {
			dic_resize(dic, dic->length * dic->growth_factor);
			return dic_add(dic, key, keyn);
		}
		dic->table[n] = keynode_new((char*)key, keyn);
		dic->value = &dic->table[n]->value;
		dic->count++;
		return 0;
	}
	struct keynode *k = dic->table[n];
	while (k) {
		if (k->len == keyn && memcmp(k->key, key, keyn) == 0) {
			dic->value = &k->value;
			return 1;
		}
		k = k->next;
	}
	dic->count++;
	struct keynode *k2 = keynode_new((char*)key, keyn);
	k2->next = dic->table[n];
	dic->table[n] = k2;
	dic->value = &k2->value;
	return 0;
}